

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol
          (Tables *this,string_view full_name,Symbol symbol)

{
  SymbolsByNameSet *common;
  pointer *ppSVar1;
  iterator __position;
  uint uVar2;
  ctrl_t cVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  anon_union_8_1_a8a14541_for_iterator_2 aVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  byte bVar32;
  bool bVar33;
  bool bVar34;
  ushort uVar35;
  int iVar36;
  Symbol *key;
  Nonnull<const_char_*> pcVar37;
  uint64_t uVar38;
  ctrl_t *pcVar39;
  slot_type *psVar40;
  ctrl_t *pcVar41;
  size_t sVar42;
  anon_union_8_1_a8a14541_for_iterator_2 aVar43;
  reference key_00;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  Symbol *b;
  Symbol *b_00;
  uint uVar44;
  PolicyFunctions *in_R9;
  size_t cap;
  ulong uVar45;
  CommonFields *common_00;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  string_view sVar49;
  FindInfo target;
  __m128i match;
  Symbol local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined4 local_b8;
  ctrl_t cStack_b4;
  ctrl_t cStack_b3;
  ctrl_t cStack_b2;
  ctrl_t cStack_b1;
  ctrl_t cStack_b0;
  ctrl_t cStack_af;
  ctrl_t cStack_ae;
  ctrl_t cStack_ad;
  ctrl_t cStack_ac;
  ctrl_t cStack_ab;
  ctrl_t cStack_aa;
  ctrl_t cStack_a9;
  ctrl_t *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  string_view local_90;
  anon_union_8_1_a8a14541_for_iterator_2 local_80;
  CommonFields *local_78;
  Tables *local_70;
  undefined1 local_68 [16];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  iterator local_40;
  
  local_a0._M_str = full_name._M_str;
  local_a0._M_len = full_name._M_len;
  local_d0.ptr_ = symbol.ptr_;
  local_90 = Symbol::full_name(&local_d0);
  if ((local_a0._M_len == local_90._M_len) &&
     ((local_a0._M_len == 0 ||
      (iVar36 = bcmp(local_a0._M_str,local_90._M_str,local_a0._M_len), iVar36 == 0)))) {
    pcVar37 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar37 = absl::lts_20250127::log_internal::
              MakeCheckOpString<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                        (&local_a0,&local_90,"full_name == symbol.full_name()");
  }
  if (pcVar37 != (Nonnull<const_char_*>)0x0) {
    AddSymbol();
LAB_00f0cbca:
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  common = &this->symbols_by_name_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertOnFind<google::protobuf::Symbol>
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ,&local_d0);
  sVar42 = (this->symbols_by_name_).
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  local_70 = this;
  if (sVar42 == 1) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::AssertNotDebugCapacity
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              );
    if ((this->symbols_by_name_).
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
        < 2) {
      sVar42 = (common->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (sVar42 != 1) {
        if (sVar42 != 0) {
          __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe3f,
                        "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                       );
        }
        goto LAB_00f0cbee;
      }
      absl::lts_20250127::container_internal::CommonFields::AssertInSooMode((CommonFields *)common);
      (this->symbols_by_name_).
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           2;
      aVar43.slot_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                     ::soo_slot(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                               );
      local_50._M_str = (char *)aVar43.slot_;
      local_50._M_len = (size_t)absl::lts_20250127::container_internal::kSooControl;
    }
    else {
      psVar40 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                ::soo_slot(&common->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          );
      bVar33 = protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
                         (psVar40,&local_d0,b_00);
      if (bVar33) {
        aVar43.slot_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       ::soo_slot(&common->
                                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                 );
        local_50._M_str = (char *)aVar43.slot_;
        local_50._M_len = (size_t)absl::lts_20250127::container_internal::kSooControl;
LAB_00f0ca98:
        bVar33 = false;
        goto LAB_00f0caf8;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::resize_impl(common,3);
      sVar49 = Symbol::full_name(&local_d0);
      uVar38 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                         (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,sVar49._M_str,
                          sVar49._M_len);
      uVar45 = (sVar49._M_len ^ uVar38) * -0x234dd359734ecb13;
      sVar42 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                         (uVar45 >> 0x38 | (uVar45 & 0xff000000000000) >> 0x28 |
                          (uVar45 & 0xff0000000000) >> 0x18 | (uVar45 & 0xff00000000) >> 8 |
                          (uVar45 & 0xff000000) << 8 | (uVar45 & 0xff0000) << 0x18 |
                          (uVar45 & 0xff00) << 0x28 | uVar45 << 0x38,8,(CommonFields *)common);
      local_50 = (basic_string_view<char,_std::char_traits<char>_>)
                 absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 ::iterator_at(&common->
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                               ,sVar42);
    }
    bVar33 = true;
  }
  else {
    if (sVar42 == 0) {
LAB_00f0cbee:
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                   );
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              );
    sVar49 = Symbol::full_name(&local_d0);
    uVar38 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                       (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,sVar49._M_str,
                        sVar49._M_len);
    local_c0 = (common->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
    if ((local_c0 + 1 & local_c0) != 0) goto LAB_00f0cbca;
    uVar45 = (uVar38 ^ sVar49._M_len) * -0x234dd359734ecb13;
    common_00 = (CommonFields *)
                (uVar45 >> 0x38 | (uVar45 & 0xff000000000000) >> 0x28 |
                 (uVar45 & 0xff0000000000) >> 0x18 | (uVar45 & 0xff00000000) >> 8 |
                 (uVar45 & 0xff000000) << 8 | (uVar45 & 0xff0000) << 0x18 |
                 (uVar45 & 0xff00) << 0x28 | uVar45 << 0x38);
    uVar46 = ((ulong)common_00 >> 7 ^
             (ulong)(this->symbols_by_name_).
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control >> 0xc) & local_c0;
    pcVar39 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::control(&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       );
    bVar32 = (byte)(uVar45 >> 0x38);
    local_50._M_str = (char *)extraout_RDX.slot_;
    local_50._M_len = (size_t)(ulong)(bVar32 & 0x7f);
    auVar47 = ZEXT216(CONCAT11(bVar32,bVar32) & 0x7f7f);
    auVar47 = pshuflw(auVar47,auVar47,0);
    local_68._0_4_ = auVar47._0_4_;
    local_68._4_4_ = local_68._0_4_;
    local_68._8_4_ = local_68._0_4_;
    local_68._12_4_ = local_68._0_4_;
    local_c8 = 0;
    local_a8 = pcVar39;
    do {
      pcVar41 = (ctrl_t *)local_50._M_len;
      pcVar39 = pcVar39 + uVar46;
      local_b8 = *(undefined4 *)pcVar39;
      auVar47[0] = -(local_68[0] == *pcVar39);
      auVar47[1] = -(local_68[1] == pcVar39[1]);
      auVar47[2] = -(local_68[2] == pcVar39[2]);
      auVar47[3] = -(local_68[3] == pcVar39[3]);
      auVar47[4] = -(local_68[4] == pcVar39[4]);
      auVar47[5] = -(local_68[5] == pcVar39[5]);
      auVar47[6] = -(local_68[6] == pcVar39[6]);
      auVar47[7] = -(local_68[7] == pcVar39[7]);
      auVar47[8] = -(local_68[8] == pcVar39[8]);
      auVar47[9] = -(local_68[9] == pcVar39[9]);
      auVar47[10] = -(local_68[10] == pcVar39[10]);
      auVar47[0xb] = -(local_68[0xb] == pcVar39[0xb]);
      auVar47[0xc] = -(local_68[0xc] == pcVar39[0xc]);
      auVar47[0xd] = -(local_68[0xd] == pcVar39[0xd]);
      auVar47[0xe] = -(local_68[0xe] == pcVar39[0xe]);
      auVar47[0xf] = -(local_68[0xf] == pcVar39[0xf]);
      uVar35 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe | (ushort)(auVar47[0xf] >> 7) << 0xf;
      uVar44 = (uint)uVar35;
      aVar19 = (anon_union_8_1_a8a14541_for_iterator_2)local_50._M_str;
      cVar3 = *pcVar39;
      cVar4 = pcVar39[1];
      cVar5 = pcVar39[2];
      cVar6 = pcVar39[3];
      cVar20 = pcVar39[4];
      cVar21 = pcVar39[5];
      cVar22 = pcVar39[6];
      cVar23 = pcVar39[7];
      cVar24 = pcVar39[8];
      cVar25 = pcVar39[9];
      cVar26 = pcVar39[10];
      cVar27 = pcVar39[0xb];
      cVar28 = pcVar39[0xc];
      cVar29 = pcVar39[0xd];
      cVar30 = pcVar39[0xe];
      cVar31 = pcVar39[0xf];
      cVar7 = cStack_b4;
      cVar8 = cStack_b3;
      cVar9 = cStack_b2;
      cVar10 = cStack_b1;
      cVar11 = cStack_b0;
      cVar12 = cStack_af;
      cVar13 = cStack_ae;
      cVar14 = cStack_ad;
      cVar15 = cStack_ac;
      cVar16 = cStack_ab;
      cVar17 = cStack_aa;
      cVar18 = cStack_a9;
      pcVar39 = local_a8;
      aVar43 = local_80;
      while (cStack_a9 = cVar31, cStack_aa = cVar30, cStack_ab = cVar29, cStack_ac = cVar28,
            cStack_ad = cVar27, cStack_ae = cVar26, cStack_af = cVar25, cStack_b0 = cVar24,
            cStack_b1 = cVar23, cStack_b2 = cVar22, cStack_b3 = cVar21, cStack_b4 = cVar20,
            local_80 = aVar19, local_a8 = pcVar39, uVar35 != 0) {
        uVar2 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        local_78 = common_00;
        psVar40 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::slot_array(&common->
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                              );
        uVar45 = uVar2 + uVar46 & local_c0;
        bVar33 = protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
                           (psVar40 + uVar45,&local_d0,b);
        if (bVar33) {
          local_50 = (basic_string_view<char,_std::char_traits<char>_>)
                     absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                     ::iterator_at(&common->
                                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                   ,uVar45);
          goto LAB_00f0ca98;
        }
        uVar35 = (ushort)(uVar44 - 1) & (ushort)uVar44;
        uVar44 = CONCAT22((short)(uVar44 - 1 >> 0x10),uVar35);
        local_50._M_str = (char *)local_80.slot_;
        local_50._M_len = (size_t)pcVar41;
        aVar19 = local_80;
        common_00 = local_78;
        cVar3 = (ctrl_t)local_b8;
        cVar4 = local_b8._1_1_;
        cVar5 = local_b8._2_1_;
        cVar6 = local_b8._3_1_;
        cVar20 = cStack_b4;
        cVar21 = cStack_b3;
        cVar22 = cStack_b2;
        cVar23 = cStack_b1;
        cVar24 = cStack_b0;
        cVar25 = cStack_af;
        cVar26 = cStack_ae;
        cVar27 = cStack_ad;
        cVar28 = cStack_ac;
        cVar29 = cStack_ab;
        cVar30 = cStack_aa;
        cVar31 = cStack_a9;
        cVar7 = cStack_b4;
        cVar8 = cStack_b3;
        cVar9 = cStack_b2;
        cVar10 = cStack_b1;
        cVar11 = cStack_b0;
        cVar12 = cStack_af;
        cVar13 = cStack_ae;
        cVar14 = cStack_ad;
        cVar15 = cStack_ac;
        cVar16 = cStack_ab;
        cVar17 = cStack_aa;
        cVar18 = cStack_a9;
        pcVar39 = local_a8;
        aVar43 = local_80;
      }
      auVar48[0] = -(cVar3 == kEmpty);
      auVar48[1] = -(cVar4 == kEmpty);
      auVar48[2] = -(cVar5 == kEmpty);
      auVar48[3] = -(cVar6 == kEmpty);
      auVar48[4] = -(cStack_b4 == kEmpty);
      auVar48[5] = -(cStack_b3 == kEmpty);
      auVar48[6] = -(cStack_b2 == kEmpty);
      auVar48[7] = -(cStack_b1 == kEmpty);
      auVar48[8] = -(cStack_b0 == kEmpty);
      auVar48[9] = -(cStack_af == kEmpty);
      auVar48[10] = -(cStack_ae == kEmpty);
      auVar48[0xb] = -(cStack_ad == kEmpty);
      auVar48[0xc] = -(cStack_ac == kEmpty);
      auVar48[0xd] = -(cStack_ab == kEmpty);
      auVar48[0xe] = -(cStack_aa == kEmpty);
      auVar48[0xf] = -(cStack_a9 == kEmpty);
      sVar42 = (common->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      local_b8 = ZEXT24((ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar48[0xf] >> 7) << 0xf));
      cStack_b4 = cVar7;
      cStack_b3 = cVar8;
      cStack_b2 = cVar9;
      cStack_b1 = cVar10;
      cStack_b0 = cVar11;
      cStack_af = cVar12;
      cStack_ae = cVar13;
      cStack_ad = cVar14;
      cStack_ac = cVar15;
      cStack_ab = cVar16;
      cStack_aa = cVar17;
      cStack_a9 = cVar18;
      local_80 = aVar43;
      if (local_b8 == ~kSentinel) {
        if (sVar42 == 0) goto LAB_00f0cbee;
        if (sVar42 < local_c8 + 0x10) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf7d,
                        "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
        uVar46 = uVar46 + local_c8 + 0x10 & local_c0;
        local_c8 = local_c8 + 0x10;
      }
      else {
        if (sVar42 == 0) goto LAB_00f0cbee;
        pcVar41 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  ::control(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                           );
        bVar33 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                           (sVar42,(size_t)common_00,pcVar41);
        if (bVar33) {
          uVar35 = 0xf;
          if ((ushort)local_b8 != 0) {
            for (; (ushort)local_b8 >> uVar35 == 0; uVar35 = uVar35 - 1) {
            }
          }
          uVar44 = (ushort)((uVar35 ^ 0xfff0) + 0x11) - 1;
        }
        else {
          uVar44 = 0;
          if (local_b8 != ~kSentinel) {
            for (; ((uint)local_b8 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
        }
        target.probe_length =
             (size_t)absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
                     ::GetPolicyFunctions()::value;
        target.offset = local_c8;
        sVar42 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                           ((container_internal *)common,common_00,uVar44 + uVar46 & local_c0,target
                            ,in_R9);
        local_50 = (basic_string_view<char,_std::char_traits<char>_>)
                   absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at(&common->
                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                 ,sVar42);
      }
      bVar33 = true;
    } while ((ushort)local_b8 == 0);
  }
LAB_00f0caf8:
  if (bVar33 != false) {
    sVar42 = (common->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    (common->
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0xffffffffffffff9c;
    *(SymbolBase **)local_50._M_str = local_d0.ptr_;
    local_90 = local_50;
    absl::lts_20250127::container_internal::CommonFields::set_capacity
              ((CommonFields *)common,sVar42);
    key_00 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ::iterator::operator*((iterator *)&local_90);
    local_40 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ::find<google::protobuf::Symbol>
                         (&common->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                          ,key_00);
    bVar34 = absl::lts_20250127::container_internal::operator==(&local_40,(iterator *)&local_50);
    if (!bVar34) {
      __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xfe2,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                   );
    }
    if (bVar33 != false) {
      __position._M_current =
           (local_70->symbols_after_checkpoint_).
           super__Vector_base<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_70->symbols_after_checkpoint_).
          super__Vector_base<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<google::protobuf::Symbol,std::allocator<google::protobuf::Symbol>>::
        _M_realloc_insert<google::protobuf::Symbol_const&>
                  ((vector<google::protobuf::Symbol,std::allocator<google::protobuf::Symbol>> *)
                   &local_70->symbols_after_checkpoint_,__position,&local_d0);
      }
      else {
        (__position._M_current)->ptr_ = local_d0.ptr_;
        ppSVar1 = &(local_70->symbols_after_checkpoint_).
                   super__Vector_base<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
  }
  return bVar33;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(absl::string_view full_name,
                                       Symbol symbol) {
  ABSL_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(symbol);
    return true;
  } else {
    return false;
  }
}